

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arm.hpp
# Opt level: O0

bool __thiscall arm::MemoryOperand::operator==(MemoryOperand *this,MemoryOperand *other)

{
  char *pcVar1;
  char *pcVar2;
  int __c;
  int __c_00;
  char *extraout_RDX;
  char *in_RSI;
  char *__s;
  variant<arm::RegisterOperand,_short> *in_RDI;
  bool r;
  bool local_31;
  uint6 in_stack_ffffffffffffffe0;
  byte bVar3;
  undefined1 in_stack_ffffffffffffffe7;
  bool local_1;
  
  bVar3 = false;
  pcVar1 = in_RSI;
  __s = in_RSI;
  if ((*(char *)((long)&(in_RDI->super__Variant_base<arm::RegisterOperand,_short>).
                        super__Move_assign_alias<arm::RegisterOperand,_short>.
                        super__Copy_assign_alias<arm::RegisterOperand,_short>.
                        super__Move_ctor_alias<arm::RegisterOperand,_short>.
                        super__Copy_ctor_alias<arm::RegisterOperand,_short>.
                        super__Variant_storage_alias<arm::RegisterOperand,_short>._M_u + 8) ==
       in_RSI[8]) &&
     (bVar3 = false,
     *(int *)((long)&(in_RDI->super__Variant_base<arm::RegisterOperand,_short>).
                     super__Move_assign_alias<arm::RegisterOperand,_short>.
                     super__Copy_assign_alias<arm::RegisterOperand,_short>.
                     super__Move_ctor_alias<arm::RegisterOperand,_short>.
                     super__Copy_ctor_alias<arm::RegisterOperand,_short>.
                     super__Variant_storage_alias<arm::RegisterOperand,_short>._M_u + 0xc) ==
     *(int *)(in_RSI + 0xc))) {
    __s = in_RSI + 0x10;
    bVar3 = std::operator==((variant<arm::RegisterOperand,_short> *)
                            CONCAT17(in_stack_ffffffffffffffe7,(uint7)in_stack_ffffffffffffffe0),
                            in_RDI);
    pcVar1 = extraout_RDX;
  }
  if ((bool)bVar3 == false) {
    local_1 = false;
  }
  else {
    pcVar1 = std::variant<arm::RegisterOperand,_short>::index
                       ((variant<arm::RegisterOperand,_short> *)
                        &(in_RDI->super__Variant_base<arm::RegisterOperand,_short>).
                         super__Move_assign_alias<arm::RegisterOperand,_short>.
                         super__Copy_assign_alias<arm::RegisterOperand,_short>.
                         super__Move_ctor_alias<arm::RegisterOperand,_short>.
                         super__Copy_ctor_alias<arm::RegisterOperand,_short>.
                         super__Variant_storage_alias<arm::RegisterOperand,_short>._M_index,__s,
                        (int)pcVar1);
    pcVar2 = std::variant<arm::RegisterOperand,_short>::index
                       ((variant<arm::RegisterOperand,_short> *)(in_RSI + 0x10),__s,__c);
    if ((pcVar1 == pcVar2) &&
       (pcVar1 = std::variant<arm::RegisterOperand,_short>::index
                           ((variant<arm::RegisterOperand,_short> *)
                            &(in_RDI->super__Variant_base<arm::RegisterOperand,_short>).
                             super__Move_assign_alias<arm::RegisterOperand,_short>.
                             super__Copy_assign_alias<arm::RegisterOperand,_short>.
                             super__Move_ctor_alias<arm::RegisterOperand,_short>.
                             super__Copy_ctor_alias<arm::RegisterOperand,_short>.
                             super__Variant_storage_alias<arm::RegisterOperand,_short>._M_index,__s,
                            __c_00), pcVar1 == (char *)0x0)) {
      local_31 = false;
      if ((bVar3 & 1) != 0) {
        local_31 = (in_RDI[1].super__Variant_base<arm::RegisterOperand,_short>.
                    super__Move_assign_alias<arm::RegisterOperand,_short>.
                    super__Copy_assign_alias<arm::RegisterOperand,_short>.
                    super__Move_ctor_alias<arm::RegisterOperand,_short>.
                    super__Copy_ctor_alias<arm::RegisterOperand,_short>.
                    super__Variant_storage_alias<arm::RegisterOperand,_short>._M_index & 1) ==
                   (in_RSI[0x28] & 1U);
      }
      return local_31;
    }
    local_1 = (bool)(bVar3 & 1);
  }
  return local_1;
}

Assistant:

bool operator==(const MemoryOperand& other) const {
    auto r =
        (kind == other.kind) && (r1 == other.r1) && (offset == other.offset);
    if (!r) return r;
    if (offset.index() == other.offset.index() && offset.index() == 0)
      return r && (neg_rm == other.neg_rm);
    else
      return r;
  }